

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::localize_global_variables(CompilerMSL *this)

{
  uint32_t *puVar1;
  bool bVar2;
  uint32_t id;
  uint *puVar3;
  VariableID local_34;
  SPIRVariable *local_30;
  SPIRVariable *var;
  uint *puStack_20;
  uint32_t v_id;
  uint *iter;
  SPIRFunction *entry_func;
  CompilerMSL *this_local;
  
  entry_func = (SPIRFunction *)this;
  id = TypedID::operator_cast_to_unsigned_int
                 ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  iter = (uint *)Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,id);
  puStack_20 = VectorView<unsigned_int>::begin
                         (&(this->super_CompilerGLSL).super_Compiler.global_variables.
                           super_VectorView<unsigned_int>);
  while (puVar1 = puStack_20,
        puVar3 = VectorView<unsigned_int>::end
                           (&(this->super_CompilerGLSL).super_Compiler.global_variables.
                             super_VectorView<unsigned_int>), puVar1 != puVar3) {
    var._4_4_ = *puStack_20;
    local_30 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var._4_4_);
    if ((local_30->storage == StorageClassPrivate) || (local_30->storage == StorageClassWorkgroup))
    {
      bVar2 = CompilerGLSL::variable_is_lut(&this->super_CompilerGLSL,local_30);
      puVar3 = iter;
      if (!bVar2) {
        TypedID<(spirv_cross::Types)2>::TypedID(&local_34,var._4_4_);
        SPIRFunction::add_local_variable((SPIRFunction *)puVar3,local_34);
      }
      puStack_20 = SmallVector<unsigned_int,_8UL>::erase
                             (&(this->super_CompilerGLSL).super_Compiler.global_variables,puStack_20
                             );
    }
    else {
      puStack_20 = puStack_20 + 1;
    }
  }
  return;
}

Assistant:

void CompilerMSL::localize_global_variables()
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto iter = global_variables.begin();
	while (iter != global_variables.end())
	{
		uint32_t v_id = *iter;
		auto &var = get<SPIRVariable>(v_id);
		if (var.storage == StorageClassPrivate || var.storage == StorageClassWorkgroup)
		{
			if (!variable_is_lut(var))
				entry_func.add_local_variable(v_id);
			iter = global_variables.erase(iter);
		}
		else
			iter++;
	}
}